

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

int Saig_ManHideBadRegs(Aig_Man_t *p,Vec_Ptr_t *vBadRegs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *Entry;
  Aig_Obj_t *pAVar6;
  int local_50;
  int i;
  int nBadRegs;
  int nTruePo;
  int nTruePi;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Vec_Ptr_t *vPosNew;
  Vec_Ptr_t *vPisNew;
  Vec_Ptr_t *vBadRegs_local;
  Aig_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(vBadRegs);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_50 = 0; iVar1 = Saig_ManRegNum(p), local_50 < iVar1; local_50 = local_50 + 1) {
      pAVar5 = Saig_ManLi(p,local_50);
      pAVar6 = Saig_ManLo(p,local_50);
      (pAVar5->field_5).pData = pAVar6;
    }
    p_00 = Vec_PtrDup(p->vCis);
    p_01 = Vec_PtrDup(p->vCos);
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManRegNum(p);
    iVar3 = Aig_ManCoNum(p);
    iVar4 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 != p->nTruePis) {
      __assert_fail("nTruePi == p->nTruePis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fa,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (iVar3 - iVar4 != p->nTruePos) {
      __assert_fail("nTruePo == p->nTruePos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fb,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    i = iVar3 - iVar4;
    nBadRegs = iVar1 - iVar2;
    for (local_50 = 0; iVar1 = Vec_PtrSize(vBadRegs), local_50 < iVar1; local_50 = local_50 + 1) {
      Entry = Vec_PtrEntry(vBadRegs,local_50);
      Vec_PtrWriteEntry(p_00,nBadRegs,*(void **)((long)Entry + 0x28));
      Vec_PtrWriteEntry(p_01,i,Entry);
      *(ulong *)((long)Entry + 0x18) = *(ulong *)((long)Entry + 0x18) & 0xffffffffffffffef | 0x10;
      i = i + 1;
      nBadRegs = nBadRegs + 1;
    }
    for (local_50 = 0; iVar1 = Saig_ManRegNum(p), local_50 < iVar1; local_50 = local_50 + 1) {
      pAVar5 = Saig_ManLi(p,local_50);
      pAVar6 = Saig_ManLo(p,local_50);
      if ((*(ulong *)&pAVar5->field_0x18 >> 4 & 1) == 0) {
        Vec_PtrWriteEntry(p_00,nBadRegs,pAVar6);
        Vec_PtrWriteEntry(p_01,i,pAVar5);
        i = i + 1;
        nBadRegs = nBadRegs + 1;
      }
      else {
        *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef;
      }
    }
    iVar1 = Aig_ManCiNum(p);
    if (nBadRegs != iVar1) {
      __assert_fail("nTruePi == Aig_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20d,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ManCoNum(p);
    if (i != iVar1) {
      __assert_fail("nTruePo == Aig_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20e,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    Vec_PtrFree(p->vCis);
    p->vCis = p_00;
    Vec_PtrFree(p->vCos);
    p->vCos = p_01;
    p_local._4_4_ = Vec_PtrSize(vBadRegs);
    p->nRegs = p->nRegs - p_local._4_4_;
    p->nTruePis = p_local._4_4_ + p->nTruePis;
    p->nTruePos = p_local._4_4_ + p->nTruePos;
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManHideBadRegs( Aig_Man_t * p, Vec_Ptr_t * vBadRegs )
{
    Vec_Ptr_t * vPisNew, * vPosNew;
    Aig_Obj_t * pObjLi, * pObjLo;
    int nTruePi, nTruePo, nBadRegs, i;
    if ( Vec_PtrSize(vBadRegs) == 0 )
        return 0;
    // attached LOs to LIs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLi->pData = pObjLo;
    // reorder them by putting bad registers first
    vPisNew = Vec_PtrDup( p->vCis );
    vPosNew = Vec_PtrDup( p->vCos );
    nTruePi = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    nTruePo = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    assert( nTruePi == p->nTruePis );
    assert( nTruePo == p->nTruePos );
    Vec_PtrForEachEntry( Aig_Obj_t *, vBadRegs, pObjLi, i )
    {
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLi->pData );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
        pObjLi->fMarkA = 1;
    }
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
    {
        if ( pObjLi->fMarkA )
        {
            pObjLi->fMarkA = 0;
            continue;
        }
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLo );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
    }
    // check the sizes
    assert( nTruePi == Aig_ManCiNum(p) );
    assert( nTruePo == Aig_ManCoNum(p) );
    // transfer the arrays
    Vec_PtrFree( p->vCis ); p->vCis = vPisNew;
    Vec_PtrFree( p->vCos ); p->vCos = vPosNew;
    // update the PIs
    nBadRegs = Vec_PtrSize(vBadRegs);
    p->nRegs -= nBadRegs;
    p->nTruePis += nBadRegs;
    p->nTruePos += nBadRegs;
    return nBadRegs;
}